

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O2

void __thiscall duckdb::DBConfig::DBConfig(DBConfig *this)

{
  _Head_base<0UL,_duckdb::SecretManager_*,_false> _Var1;
  _Head_base<0UL,_duckdb::SecretManager_*,_false> _Var2;
  _Head_base<0UL,_duckdb::SecretManager_*,_false> local_88;
  unique_ptr<duckdb::ErrorManager,_std::default_delete<duckdb::ErrorManager>,_true> *local_80;
  unique_ptr<duckdb::IndexTypeSet,_std::default_delete<duckdb::IndexTypeSet>,_true> *local_78;
  unique_ptr<duckdb::CollationBinding,_std::default_delete<duckdb::CollationBinding>,_true>
  *local_70;
  unique_ptr<duckdb::CastFunctionSet,_std::default_delete<duckdb::CastFunctionSet>,_true> *local_68;
  unique_ptr<duckdb::CompressionFunctionSet,_std::default_delete<duckdb::CompressionFunctionSet>,_true>
  *local_40;
  DBConfigOptions *local_38;
  
  (this->replacement_scans).
  super_vector<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>.
  super__Vector_base<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->replacement_scans).
  super_vector<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>.
  super__Vector_base<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->config_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->replacement_scans).
  super_vector<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>.
  super__Vector_base<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined8 *)((long)&(this->config_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->config_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->config_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->config_lock).super___mutex_base._M_mutex + 8) = 0;
  (this->extension_parameters)._M_h._M_buckets = &(this->extension_parameters)._M_h._M_single_bucket
  ;
  (this->extension_parameters)._M_h._M_bucket_count = 1;
  (this->extension_parameters)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->extension_parameters)._M_h._M_element_count = 0;
  (this->extension_parameters)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->extension_parameters)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->extension_parameters)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->file_system).super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>
  ._M_t.super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
  super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl = (FileSystem *)0x0;
  (this->secret_manager).
  super_unique_ptr<duckdb::SecretManager,_std::default_delete<duckdb::SecretManager>_>._M_t.
  super___uniq_ptr_impl<duckdb::SecretManager,_std::default_delete<duckdb::SecretManager>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SecretManager_*,_std::default_delete<duckdb::SecretManager>_>.
  super__Head_base<0UL,_duckdb::SecretManager_*,_false>._M_head_impl = (SecretManager *)0x0;
  (this->allocator).super_unique_ptr<duckdb::Allocator,_std::default_delete<duckdb::Allocator>_>.
  _M_t.super___uniq_ptr_impl<duckdb::Allocator,_std::default_delete<duckdb::Allocator>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Allocator_*,_std::default_delete<duckdb::Allocator>_>.
  super__Head_base<0UL,_duckdb::Allocator_*,_false>._M_head_impl = (Allocator *)0x0;
  DBConfigOptions::DBConfigOptions(&this->options);
  local_80 = &this->error_manager;
  (this->operator_extensions).
  super_vector<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->operator_extensions).
  super_vector<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->default_allocator).internal.
  super___shared_ptr<duckdb::Allocator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->operator_extensions).
  super_vector<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->error_manager).
  super_unique_ptr<duckdb::ErrorManager,_std::default_delete<duckdb::ErrorManager>_>._M_t.
  super___uniq_ptr_impl<duckdb::ErrorManager,_std::default_delete<duckdb::ErrorManager>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ErrorManager_*,_std::default_delete<duckdb::ErrorManager>_>.
  super__Head_base<0UL,_duckdb::ErrorManager_*,_false>._M_head_impl = (ErrorManager *)0x0;
  (this->default_allocator).internal.
  super___shared_ptr<duckdb::Allocator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->optimizer_extensions).
  super_vector<duckdb::OptimizerExtension,_std::allocator<duckdb::OptimizerExtension>_>.
  super__Vector_base<duckdb::OptimizerExtension,_std::allocator<duckdb::OptimizerExtension>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->optimizer_extensions).
  super_vector<duckdb::OptimizerExtension,_std::allocator<duckdb::OptimizerExtension>_>.
  super__Vector_base<duckdb::OptimizerExtension,_std::allocator<duckdb::OptimizerExtension>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->parser_extensions).
  super_vector<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_>.
  super__Vector_base<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->optimizer_extensions).
  super_vector<duckdb::OptimizerExtension,_std::allocator<duckdb::OptimizerExtension>_>.
  super__Vector_base<duckdb::OptimizerExtension,_std::allocator<duckdb::OptimizerExtension>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->parser_extensions).
  super_vector<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_>.
  super__Vector_base<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->parser_extensions).
  super_vector<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_>.
  super__Vector_base<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->storage_extensions)._M_h._M_buckets = &(this->storage_extensions)._M_h._M_single_bucket;
  (this->storage_extensions)._M_h._M_bucket_count = 1;
  (this->storage_extensions)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->storage_extensions)._M_h._M_element_count = 0;
  (this->storage_extensions)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_68 = &this->cast_functions;
  local_70 = &this->collation_bindings;
  local_78 = &this->index_types;
  local_38 = &this->options;
  switchD_016d4fed::default(&(this->storage_extensions)._M_h._M_rehash_policy._M_next_resize,0,0x98)
  ;
  this->is_user_config = true;
  local_40 = &this->compression_functions;
  make_uniq<duckdb::CompressionFunctionSet>();
  _Var1._M_head_impl = local_88._M_head_impl;
  local_88._M_head_impl = (SecretManager *)0x0;
  ::std::
  __uniq_ptr_impl<duckdb::CompressionFunctionSet,_std::default_delete<duckdb::CompressionFunctionSet>_>
  ::reset((__uniq_ptr_impl<duckdb::CompressionFunctionSet,_std::default_delete<duckdb::CompressionFunctionSet>_>
           *)&this->compression_functions,(pointer)_Var1._M_head_impl);
  ::std::
  unique_ptr<duckdb::CompressionFunctionSet,_std::default_delete<duckdb::CompressionFunctionSet>_>::
  ~unique_ptr((unique_ptr<duckdb::CompressionFunctionSet,_std::default_delete<duckdb::CompressionFunctionSet>_>
               *)&local_88);
  make_uniq<duckdb::EncodingFunctionSet>();
  _Var1._M_head_impl = local_88._M_head_impl;
  local_88._M_head_impl = (SecretManager *)0x0;
  ::std::
  __uniq_ptr_impl<duckdb::EncodingFunctionSet,_std::default_delete<duckdb::EncodingFunctionSet>_>::
  reset((__uniq_ptr_impl<duckdb::EncodingFunctionSet,_std::default_delete<duckdb::EncodingFunctionSet>_>
         *)&this->encoding_functions,(pointer)_Var1._M_head_impl);
  ::std::unique_ptr<duckdb::EncodingFunctionSet,_std::default_delete<duckdb::EncodingFunctionSet>_>
  ::~unique_ptr((unique_ptr<duckdb::EncodingFunctionSet,_std::default_delete<duckdb::EncodingFunctionSet>_>
                 *)&local_88);
  unique_ptr<duckdb::EncodingFunctionSet,_std::default_delete<duckdb::EncodingFunctionSet>,_true>::
  operator->(&this->encoding_functions);
  EncodingFunctionSet::Initialize(this);
  make_uniq<duckdb::ArrowTypeExtensionSet>();
  _Var1._M_head_impl = local_88._M_head_impl;
  local_88._M_head_impl = (SecretManager *)0x0;
  ::std::
  __uniq_ptr_impl<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>_>
  ::reset((__uniq_ptr_impl<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>_>
           *)&this->arrow_extensions,(pointer)_Var1._M_head_impl);
  ::std::
  unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>_>::
  ~unique_ptr((unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>_>
               *)&local_88);
  unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
  ::operator->(&this->arrow_extensions);
  ArrowTypeExtensionSet::Initialize(this);
  make_uniq<duckdb::CastFunctionSet,duckdb::DBConfig&>((duckdb *)&local_88,this);
  _Var1._M_head_impl = local_88._M_head_impl;
  local_88._M_head_impl = (SecretManager *)0x0;
  ::std::__uniq_ptr_impl<duckdb::CastFunctionSet,_std::default_delete<duckdb::CastFunctionSet>_>::
  reset((__uniq_ptr_impl<duckdb::CastFunctionSet,_std::default_delete<duckdb::CastFunctionSet>_> *)
        local_68,(pointer)_Var1._M_head_impl);
  ::std::unique_ptr<duckdb::CastFunctionSet,_std::default_delete<duckdb::CastFunctionSet>_>::
  ~unique_ptr((unique_ptr<duckdb::CastFunctionSet,_std::default_delete<duckdb::CastFunctionSet>_> *)
              &local_88);
  make_uniq<duckdb::CollationBinding>();
  _Var1._M_head_impl = local_88._M_head_impl;
  local_88._M_head_impl = (SecretManager *)0x0;
  ::std::__uniq_ptr_impl<duckdb::CollationBinding,_std::default_delete<duckdb::CollationBinding>_>::
  reset((__uniq_ptr_impl<duckdb::CollationBinding,_std::default_delete<duckdb::CollationBinding>_> *
        )local_70,(pointer)_Var1._M_head_impl);
  ::std::unique_ptr<duckdb::CollationBinding,_std::default_delete<duckdb::CollationBinding>_>::
  ~unique_ptr((unique_ptr<duckdb::CollationBinding,_std::default_delete<duckdb::CollationBinding>_>
               *)&local_88);
  make_uniq<duckdb::IndexTypeSet>();
  _Var1._M_head_impl = local_88._M_head_impl;
  local_88._M_head_impl = (SecretManager *)0x0;
  ::std::__uniq_ptr_impl<duckdb::IndexTypeSet,_std::default_delete<duckdb::IndexTypeSet>_>::reset
            ((__uniq_ptr_impl<duckdb::IndexTypeSet,_std::default_delete<duckdb::IndexTypeSet>_> *)
             local_78,(pointer)_Var1._M_head_impl);
  ::std::unique_ptr<duckdb::IndexTypeSet,_std::default_delete<duckdb::IndexTypeSet>_>::~unique_ptr
            ((unique_ptr<duckdb::IndexTypeSet,_std::default_delete<duckdb::IndexTypeSet>_> *)
             &local_88);
  make_uniq<duckdb::ErrorManager>();
  _Var1._M_head_impl = local_88._M_head_impl;
  local_88._M_head_impl = (SecretManager *)0x0;
  ::std::__uniq_ptr_impl<duckdb::ErrorManager,_std::default_delete<duckdb::ErrorManager>_>::reset
            ((__uniq_ptr_impl<duckdb::ErrorManager,_std::default_delete<duckdb::ErrorManager>_> *)
             local_80,(pointer)_Var1._M_head_impl);
  ::std::unique_ptr<duckdb::ErrorManager,_std::default_delete<duckdb::ErrorManager>_>::~unique_ptr
            ((unique_ptr<duckdb::ErrorManager,_std::default_delete<duckdb::ErrorManager>_> *)
             &local_88);
  make_uniq<duckdb::SecretManager>();
  _Var2._M_head_impl = local_88._M_head_impl;
  local_88._M_head_impl = (SecretManager *)0x0;
  _Var1._M_head_impl =
       (this->secret_manager).
       super_unique_ptr<duckdb::SecretManager,_std::default_delete<duckdb::SecretManager>_>._M_t.
       super___uniq_ptr_impl<duckdb::SecretManager,_std::default_delete<duckdb::SecretManager>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::SecretManager_*,_std::default_delete<duckdb::SecretManager>_>.
       super__Head_base<0UL,_duckdb::SecretManager_*,_false>._M_head_impl;
  (this->secret_manager).
  super_unique_ptr<duckdb::SecretManager,_std::default_delete<duckdb::SecretManager>_>._M_t.
  super___uniq_ptr_impl<duckdb::SecretManager,_std::default_delete<duckdb::SecretManager>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SecretManager_*,_std::default_delete<duckdb::SecretManager>_>.
  super__Head_base<0UL,_duckdb::SecretManager_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (SecretManager *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_SecretManager + 8))();
    if (local_88._M_head_impl != (SecretManager *)0x0) {
      (*(local_88._M_head_impl)->_vptr_SecretManager[1])();
    }
  }
  return;
}

Assistant:

DBConfig::DBConfig() {
	compression_functions = make_uniq<CompressionFunctionSet>();
	encoding_functions = make_uniq<EncodingFunctionSet>();
	encoding_functions->Initialize(*this);
	arrow_extensions = make_uniq<ArrowTypeExtensionSet>();
	arrow_extensions->Initialize(*this);
	cast_functions = make_uniq<CastFunctionSet>(*this);
	collation_bindings = make_uniq<CollationBinding>();
	index_types = make_uniq<IndexTypeSet>();
	error_manager = make_uniq<ErrorManager>();
	secret_manager = make_uniq<SecretManager>();
}